

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::CheckerInstantiationSyntax::setChild
          (CheckerInstantiationSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar1;
  SyntaxNode *pSVar2;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *pSVar3;
  logic_error *this_00;
  Token TVar4;
  ParameterValueAssignmentSyntax *local_140;
  NameSyntax *local_138;
  string local_110;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined8 local_38;
  Info *local_30;
  NameSyntax *local_28;
  NameSyntax *local_20;
  size_t local_18;
  size_t index_local;
  CheckerInstantiationSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar1 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (pSVar2);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=
              (&(this->super_MemberSyntax).attributes,pSVar1);
    break;
  case 1:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_138 = (NameSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_138 = SyntaxNode::as<slang::syntax::NameSyntax>(pSVar2);
    }
    local_28 = local_138;
    not_null<slang::syntax::NameSyntax*>::not_null<slang::syntax::NameSyntax*,void>
              ((not_null<slang::syntax::NameSyntax*> *)&local_20,&local_28);
    (this->type).ptr = local_20;
    break;
  case 2:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_140 = (ParameterValueAssignmentSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_140 = SyntaxNode::as<slang::syntax::ParameterValueAssignmentSyntax>(pSVar2);
    }
    this->parameters = local_140;
    break;
  case 3:
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar3 = SyntaxNode::
             as<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>>
                       (pSVar2);
    SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::operator=
              (&this->instances,pSVar3);
    break;
  case 4:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar4._0_8_;
    (this->semi).kind = (undefined2)local_38;
    (this->semi).field_0x2 = local_38._2_1_;
    (this->semi).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->semi).rawLen = local_38._4_4_;
    local_30 = TVar4.info;
    (this->semi).info = local_30;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_d9);
    std::operator+(&local_b8,&local_d8,":");
    std::__cxx11::to_string(&local_110,0x7a2);
    std::operator+(&local_98,&local_b8,&local_110);
    std::operator+(&local_78,&local_98,": ");
    std::operator+(&local_58,&local_78,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_58);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void CheckerInstantiationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: type = child.node() ? &child.node()->as<NameSyntax>() : nullptr; return;
        case 2: parameters = child.node() ? &child.node()->as<ParameterValueAssignmentSyntax>() : nullptr; return;
        case 3: instances = child.node()->as<SeparatedSyntaxList<HierarchicalInstanceSyntax>>(); return;
        case 4: semi = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}